

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O2

void adapt::cuf::detail::WriteInt<int>(ostringstream *str,int *arg,char mod)

{
  int iVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000011;
  
  iVar1 = (int)CONCAT71(in_register_00000011,mod);
  switch(iVar1) {
  case 0x67:
    Write_impl<char,_int,_true>::f((ostream *)str,arg);
    return;
  case 0x68:
    Write_impl<short,_int,_true>::f((ostream *)str,arg);
    return;
  case 0x69:
  case 0x6a:
  case 0x6b:
    goto switchD_0010a489_caseD_69;
  case 0x6c:
    Write_impl<long,_int,_true>::f((ostream *)str,arg);
    return;
  case 0x6d:
    Write_impl<long_long,_int,_true>::f((ostream *)str,arg);
    return;
  default:
    if (iVar1 == 0x3f) {
      std::ostream::operator<<(str,*arg);
      return;
    }
    if (iVar1 == 0) {
      Write_impl<int,_int,_true>::f((ostream *)str,arg);
      return;
    }
switchD_0010a489_caseD_69:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::__cxx11::string::pop_back;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
}

Assistant:

void WriteInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 0: Write<int>(str, arg); break;
	case 'l': Write<long>(str, arg); break;
	case 'm': Write<long long>(str, arg); break;
	case 'h': Write<short>(str, arg); break;
	case 'g': Write<char>(str, arg); break;
	case '?': WriteAnyInt(str, arg); break;
	default: throw std::exception(); break;
	}
}